

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

AggregateFunction *
duckdb::MedianFunction::GetAggregate(AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  char cVar1;
  
  cVar1 = duckdb::LogicalType::HasAlias();
  if (((cVar1 == '\0') && ((ulong)(byte)*type < 0x33)) &&
     ((0x60005f0fff802U >> ((ulong)(byte)*type & 0x3f) & 1) != 0)) {
    GetContinuousQuantileTemplated<duckdb::ScalarContinuousQuantile>(__return_storage_ptr__,type);
  }
  else {
    GetDiscreteQuantileTemplated<duckdb::ScalarDiscreteQuantile>(__return_storage_ptr__,type);
  }
  std::__cxx11::string::assign(&__return_storage_ptr__->field_0x8);
  __return_storage_ptr__->serialize = QuantileBindData::Serialize;
  __return_storage_ptr__->deserialize = Deserialize;
  return __return_storage_ptr__;
}

Assistant:

static AggregateFunction GetAggregate(const LogicalType &type) {
		auto fun = CanInterpolate(type) ? GetContinuousQuantile(type) : GetDiscreteQuantile(type);
		fun.name = "median";
		fun.serialize = QuantileBindData::Serialize;
		fun.deserialize = Deserialize;
		return fun;
	}